

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mftr(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,int rt,int rd,int u,int sel,
             int h)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_ptr pTVar1;
  int nargs;
  uintptr_t o;
  TCGv_i64 arg;
  TCGv_i32 pTVar2;
  uintptr_t o_1;
  TCGv_i32 fp0;
  int32_t iVar3;
  code *pcVar4;
  TCGTemp *args [1];
  
  tcg_ctx = ctx->uc->tcg_ctx;
  iVar3 = env->CP0_VPEControl;
  arg = tcg_temp_local_new_i64(tcg_ctx);
  if ((((env->CP0_VPEConf0 & 2) == 0) &&
      ((((env->active_tc).CP0_TCBind ^ env->tcs[(byte)iVar3].CP0_TCBind) & 0xfU) != 0)) ||
     ((byte)env->mvp->CP0_MVPConf0 < (byte)env->CP0_VPEControl)) {
    tcg_gen_movi_i64_mips64el(tcg_ctx,arg,-1);
    goto LAB_00879abf;
  }
  if (u == 0) {
    switch(rt) {
    case 1:
      if (sel == 2) {
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_vpeconf0_mips64el;
      }
      else {
        if (sel != 1) goto switchD_00879b08_default;
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_vpecontrol_mips64el;
      }
      break;
    case 2:
      switch(sel) {
      case 1:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tcstatus_mips64el;
        break;
      case 2:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tcbind_mips64el;
        break;
      case 3:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tcrestart_mips64el;
        break;
      case 4:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tchalt_mips64el;
        break;
      case 5:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tccontext_mips64el;
        break;
      case 6:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tcschedule_mips64el;
        break;
      case 7:
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        pcVar4 = helper_mftc0_tcschefback_mips64el;
        break;
      default:
        rt = 2;
        goto LAB_00879dca;
      }
      tcg_gen_callN_mips64el(tcg_ctx,pcVar4,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur),1,args);
      goto LAB_00879abf;
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xb:
switchD_00879b74_caseD_3:
LAB_00879dca:
      gen_mfc0(ctx,arg,rt,sel);
      goto LAB_00879abf;
    case 10:
      if (sel != 0) {
        rt = 10;
        goto LAB_00879dca;
      }
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar4 = helper_mftc0_entryhi_mips64el;
      break;
    case 0xc:
      if (sel != 0) {
        rt = 0xc;
        goto LAB_00879dca;
      }
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar4 = helper_mftc0_status_mips64el;
      break;
    case 0xd:
      if (sel != 0) goto switchD_00879b08_default;
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar4 = helper_mftc0_cause_mips64el;
      break;
    case 0xe:
      if (sel != 0) goto switchD_00879b08_default;
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar4 = helper_mftc0_epc_mips64el;
      break;
    case 0xf:
      if (sel != 1) goto switchD_00879b08_default;
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar4 = helper_mftc0_ebase_mips64el;
      break;
    case 0x10:
      if (7 < (uint)sel) goto switchD_00879b08_default;
      pTVar1 = tcg_ctx->cpu_env;
      tcg_const_i64_mips64el(tcg_ctx,(ulong)(uint)sel);
      pcVar4 = helper_mftc0_configx_mips64el;
      nargs = 2;
      args[0] = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
      goto LAB_00879f17;
    default:
      if (rt != 0x17) goto switchD_00879b74_caseD_3;
      if (sel != 0) {
        rt = 0x17;
        goto LAB_00879dca;
      }
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      pcVar4 = helper_mftc0_debug_mips64el;
    }
LAB_00879f15:
    nargs = 1;
LAB_00879f17:
    tcg_gen_callN_mips64el(tcg_ctx,pcVar4,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur),nargs,args);
    goto LAB_00879abf;
  }
  switch(sel) {
  case 0:
    pTVar2 = tcg_const_i32_mips64el(tcg_ctx,rt);
    args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_mips64el
              (tcg_ctx,helper_mftgpr_mips64el,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur),2,args);
    goto LAB_00879fe1;
  case 1:
    break;
  case 2:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    if (h == 0) {
      gen_load_fpr32(ctx,pTVar2,rt);
    }
    else {
      gen_load_fpr32h(ctx,pTVar2,rt);
    }
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,arg,pTVar2);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar2 + (long)&tcg_ctx->pool_cur));
    goto LAB_00879abf;
  case 3:
    pTVar2 = tcg_const_i32_mips64el(tcg_ctx,rt);
    gen_helper_cfc1(tcg_ctx,arg,tcg_ctx->cpu_env,pTVar2);
    goto LAB_00879fe1;
  default:
switchD_00879b08_default:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg + (long)tcg_ctx));
    generate_exception_end(ctx,0x14);
    return;
  }
  switch(rt) {
  case 0:
    iVar3 = 0;
    break;
  case 1:
    iVar3 = 0;
    goto LAB_00879f5e;
  case 2:
    iVar3 = 0;
    goto LAB_00879fbc;
  default:
    goto switchD_00879b08_default;
  case 4:
    iVar3 = 1;
    break;
  case 5:
    iVar3 = 1;
    goto LAB_00879f5e;
  case 6:
    iVar3 = 1;
    goto LAB_00879fbc;
  case 8:
    iVar3 = 2;
    break;
  case 9:
    iVar3 = 2;
    goto LAB_00879f5e;
  case 10:
    iVar3 = 2;
    goto LAB_00879fbc;
  case 0xc:
    iVar3 = 3;
    break;
  case 0xd:
    iVar3 = 3;
LAB_00879f5e:
    pTVar2 = tcg_const_i32_mips64el(tcg_ctx,iVar3);
    gen_helper_mfthi(tcg_ctx,arg,tcg_ctx->cpu_env,pTVar2);
    goto LAB_00879fe1;
  case 0xe:
    iVar3 = 3;
LAB_00879fbc:
    pTVar2 = tcg_const_i32_mips64el(tcg_ctx,iVar3);
    gen_helper_mftacx(tcg_ctx,arg,tcg_ctx->cpu_env,pTVar2);
    goto LAB_00879fe1;
  case 0x10:
    args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    pcVar4 = helper_mftdsp_mips64el;
    goto LAB_00879f15;
  }
  pTVar2 = tcg_const_i32_mips64el(tcg_ctx,iVar3);
  gen_helper_mftlo(tcg_ctx,arg,tcg_ctx->cpu_env,pTVar2);
LAB_00879fe1:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
LAB_00879abf:
  gen_store_gpr(tcg_ctx,arg,rd);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mftr(CPUMIPSState *env, DisasContext *ctx, int rt, int rd,
                     int u, int sel, int h)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);

    if ((env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) == 0 &&
        ((env->tcs[other_tc].CP0_TCBind & (0xf << CP0TCBd_CurVPE)) !=
         (env->active_tc.CP0_TCBind & (0xf << CP0TCBd_CurVPE)))) {
        tcg_gen_movi_tl(tcg_ctx, t0, -1);
    } else if ((env->CP0_VPEControl & (0xff << CP0VPECo_TargTC)) >
               (env->mvp->CP0_MVPConf0 & (0xff << CP0MVPC0_PTC))) {
        tcg_gen_movi_tl(tcg_ctx, t0, -1);
    } else if (u == 0) {
        switch (rt) {
        case 1:
            switch (sel) {
            case 1:
                gen_helper_mftc0_vpecontrol(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 2:
                gen_helper_mftc0_vpeconf0(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 2:
            switch (sel) {
            case 1:
                gen_helper_mftc0_tcstatus(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 2:
                gen_helper_mftc0_tcbind(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 3:
                gen_helper_mftc0_tcrestart(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 4:
                gen_helper_mftc0_tchalt(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 5:
                gen_helper_mftc0_tccontext(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 6:
                gen_helper_mftc0_tcschedule(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 7:
                gen_helper_mftc0_tcschefback(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 10:
            switch (sel) {
            case 0:
                gen_helper_mftc0_entryhi(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 12:
            switch (sel) {
            case 0:
                gen_helper_mftc0_status(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 13:
            switch (sel) {
            case 0:
                gen_helper_mftc0_cause(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 14:
            switch (sel) {
            case 0:
                gen_helper_mftc0_epc(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 15:
            switch (sel) {
            case 1:
                gen_helper_mftc0_ebase(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 16:
            switch (sel) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 6:
            case 7:
                gen_helper_mftc0_configx(tcg_ctx, t0, tcg_ctx->cpu_env, tcg_const_tl(tcg_ctx, sel));
                break;
            default:
                goto die;
                break;
            }
            break;
        case 23:
            switch (sel) {
            case 0:
                gen_helper_mftc0_debug(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        default:
            gen_mfc0(ctx, t0, rt, sel);
        }
    } else {
        switch (sel) {
        /* GPR registers. */
        case 0:
            gen_helper_1e0i(mftgpr, t0, rt);
            break;
        /* Auxiliary CPU registers */
        case 1:
            switch (rt) {
            case 0:
                gen_helper_1e0i(mftlo, t0, 0);
                break;
            case 1:
                gen_helper_1e0i(mfthi, t0, 0);
                break;
            case 2:
                gen_helper_1e0i(mftacx, t0, 0);
                break;
            case 4:
                gen_helper_1e0i(mftlo, t0, 1);
                break;
            case 5:
                gen_helper_1e0i(mfthi, t0, 1);
                break;
            case 6:
                gen_helper_1e0i(mftacx, t0, 1);
                break;
            case 8:
                gen_helper_1e0i(mftlo, t0, 2);
                break;
            case 9:
                gen_helper_1e0i(mfthi, t0, 2);
                break;
            case 10:
                gen_helper_1e0i(mftacx, t0, 2);
                break;
            case 12:
                gen_helper_1e0i(mftlo, t0, 3);
                break;
            case 13:
                gen_helper_1e0i(mfthi, t0, 3);
                break;
            case 14:
                gen_helper_1e0i(mftacx, t0, 3);
                break;
            case 16:
                gen_helper_mftdsp(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
            }
            break;
        /* Floating point (COP1). */
        case 2:
            /* XXX: For now we support only a single FPU context. */
            if (h == 0) {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                gen_load_fpr32(ctx, fp0, rt);
                tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
                tcg_temp_free_i32(tcg_ctx, fp0);
            } else {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                gen_load_fpr32h(ctx, fp0, rt);
                tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
                tcg_temp_free_i32(tcg_ctx, fp0);
            }
            break;
        case 3:
            /* XXX: For now we support only a single FPU context. */
            gen_helper_1e0i(cfc1, t0, rt);
            break;
        /* COP2: Not implemented. */
        case 4:
        case 5:
            /* fall through */
        default:
            goto die;
        }
    }
    gen_store_gpr(tcg_ctx, t0, rd);
    tcg_temp_free(tcg_ctx, t0);
    return;

die:
    tcg_temp_free(tcg_ctx, t0);
    LOG_DISAS("mftr (reg %d u %d sel %d h %d)\n", rt, u, sel, h);
    generate_exception_end(ctx, EXCP_RI);
}